

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

double matlab_std(double *x,int x_length)

{
  double dVar1;
  int local_34;
  double dStack_30;
  int i_1;
  double s;
  double dStack_20;
  int i;
  double average;
  int x_length_local;
  double *x_local;
  
  dStack_20 = 0.0;
  for (s._4_4_ = 0; s._4_4_ < x_length; s._4_4_ = s._4_4_ + 1) {
    dStack_20 = x[s._4_4_] + dStack_20;
  }
  dStack_30 = 0.0;
  for (local_34 = 0; local_34 < x_length; local_34 = local_34 + 1) {
    dVar1 = pow(x[local_34] - dStack_20 / (double)x_length,2.0);
    dStack_30 = dVar1 + dStack_30;
  }
  dVar1 = sqrt(dStack_30 / (double)(x_length + -1));
  return dVar1;
}

Assistant:

double matlab_std(const double *x, int x_length) {
  double average = 0.0;
  for (int i = 0; i < x_length; ++i) average += x[i];
  average /= x_length;

  double s = 0.0;
  for (int i = 0; i < x_length; ++i) s += pow(x[i] - average, 2.0);
  s /= (x_length - 1);

  return sqrt(s);
}